

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void door_handling_interior(tgestate_t *state,vischar_t *vischar)

{
  doorindex_t index;
  byte bVar1;
  byte bVar2;
  door_t *pdVar3;
  int iVar4;
  door_t *pdVar5;
  tgestate_t *state_00;
  long in_RSI;
  long in_RDI;
  uint8_t v;
  uint8_t u;
  mappos16_t *mappos;
  mappos8_t *doormappos;
  door_t *door;
  uint8_t room_and_flags;
  doorindex_t current_door;
  doorindex_t *pdoors;
  doorindex_t *local_18;
  
  local_18 = (doorindex_t *)(in_RDI + 0x6a6);
  do {
    index = *local_18;
    if (index == 0xff) {
      return;
    }
    *(doorindex_t *)(in_RDI + 0x121) = index;
    pdVar5 = get_door(index);
    bVar1 = pdVar5->room_and_direction;
    if ((*(byte *)(in_RSI + 0x1a) & 3) == (bVar1 & 3)) {
      state_00 = (tgestate_t *)(in_RDI + 0x668);
      bVar2 = (pdVar5->mappos).u;
      if (((((int)(bVar2 - 3) < (int)(uint)(ushort)state_00->width) &&
           ((ushort)state_00->width <= (ushort)(bVar2 + 3))) &&
          (bVar2 = (pdVar5->mappos).v, (int)(bVar2 - 3) < (int)(uint)*(ushort *)(in_RDI + 0x66a)))
         && (*(ushort *)(in_RDI + 0x66a) <= (ushort)(bVar2 + 3))) {
        iVar4 = is_door_locked(state_00);
        if (iVar4 != 0) {
          return;
        }
        *(char *)(in_RSI + 0x3c) = (char)((int)(uint)bVar1 >> 2);
        pdVar3 = pdVar5 + 1;
        if ((*(byte *)(in_RDI + 0x121) & 0x80) != 0) {
          pdVar3 = pdVar5 + -1;
        }
        transition((tgestate_t *)&pdVar3->mappos,(mappos8_t *)state_00);
        return;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void door_handling_interior(tgestate_t *state, vischar_t *vischar)
{
  doorindex_t     *pdoors;         /* was HL */
  doorindex_t      current_door;   /* was A */
  uint8_t          room_and_flags; /* was A */
  const door_t    *door;           /* was HL' */
  const mappos8_t *doormappos;     /* was HL' */
  mappos16_t      *mappos;         /* was DE' */
  uint8_t          u;              /* was A */
  uint8_t          v;              /* was A */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  for (pdoors = &state->interior_doors[0]; ; pdoors++)
  {
    current_door = *pdoors;
    if (current_door == interiordoor_NONE)
      return; /* Reached end of list. */

    state->current_door = current_door;

    door = get_door(current_door);
    room_and_flags = door->room_and_direction;

    /* Does the character face the same direction as the door? */
    if ((vischar->direction & vischar_DIRECTION_MASK) != (room_and_flags & door_FLAGS_MASK_DIRECTION))
      continue;

    /* Skip any door which is more than three units away. */
    doormappos = &door->mappos;
    mappos = &state->saved_mappos.pos16; // reusing saved_mappos as 8-bit here? a case for saved_mappos being a union of pos8 and pos types?
    u = doormappos->u;
    if (u - 3 >= mappos->u || u + 3 < mappos->u) // -3 .. +2
      continue;
    v = doormappos->v;
    if (v - 3 >= mappos->v || v + 3 < mappos->v) // -3 .. +2
      continue;

    if (is_door_locked(state))
      return; /* The door was locked. */

    vischar->room = room_and_flags >> 2;

    doormappos = &door[1].mappos;
    if (state->current_door & door_REVERSE)
      doormappos = &door[-1].mappos;

    transition(state, doormappos); /* was tail call */
    NEVER_RETURNS; // check
  }
}